

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptor
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  int iVar1;
  int iVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  EnumDescriptor *descriptor_00;
  mapped_type *pmVar5;
  string *psVar6;
  allocator<char> local_141;
  key_type local_140;
  int local_120;
  allocator<char> local_119;
  int j;
  allocator<char> local_f1;
  key_type local_f0;
  string local_d0;
  OneofDescriptor *local_b0;
  OneofDescriptor *oneof;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  int i_3;
  EnumDescriptor *enum_descriptor;
  int i_2;
  allocator<char> local_51;
  string local_50;
  FieldDescriptor *local_30;
  FieldDescriptor *field_descriptor;
  int i_1;
  int i;
  Descriptor *containing_descriptor_local;
  Descriptor *descriptor_local;
  Generator *this_local;
  
  field_descriptor._4_4_ = 0;
  _i_1 = containing_descriptor;
  containing_descriptor_local = descriptor;
  descriptor_local = (Descriptor *)this;
  while( true ) {
    iVar2 = field_descriptor._4_4_;
    iVar1 = Descriptor::nested_type_count(containing_descriptor_local);
    if (iVar1 <= iVar2) break;
    pDVar3 = Descriptor::nested_type(containing_descriptor_local,field_descriptor._4_4_);
    FixForeignFieldsInDescriptor(this,pDVar3,containing_descriptor_local);
    field_descriptor._4_4_ = field_descriptor._4_4_ + 1;
  }
  field_descriptor._0_4_ = 0;
  while( true ) {
    iVar2 = (int)field_descriptor;
    iVar1 = Descriptor::field_count(containing_descriptor_local);
    if (iVar1 <= iVar2) break;
    pFVar4 = Descriptor::field(containing_descriptor_local,(int)field_descriptor);
    pDVar3 = containing_descriptor_local;
    local_30 = pFVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"fields_by_name",&local_51);
    FixForeignFieldsInField(this,pDVar3,pFVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    field_descriptor._0_4_ = (int)field_descriptor + 1;
  }
  FixContainingTypeInDescriptor<google::protobuf::Descriptor>(this,containing_descriptor_local,_i_1)
  ;
  enum_descriptor._0_4_ = 0;
  while( true ) {
    iVar2 = Descriptor::enum_type_count(containing_descriptor_local);
    if (iVar2 <= (int)enum_descriptor) break;
    descriptor_00 = Descriptor::enum_type(containing_descriptor_local,(int)enum_descriptor);
    FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
              (this,descriptor_00,containing_descriptor_local);
    enum_descriptor._0_4_ = (int)enum_descriptor + 1;
  }
  m._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  while( true ) {
    iVar2 = m._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    iVar1 = Descriptor::oneof_decl_count(containing_descriptor_local);
    if (iVar1 <= iVar2) break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&oneof);
    local_b0 = Descriptor::oneof_decl
                         (containing_descriptor_local,
                          m._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_d0,this,containing_descriptor_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"descriptor_name",&local_f1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&oneof,&local_f0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::~string((string *)&local_d0);
    psVar6 = OneofDescriptor::name_abi_cxx11_(local_b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&j,"oneof_name",&local_119);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&oneof,(key_type *)&j);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar6);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator(&local_119);
    local_120 = 0;
    while( true ) {
      iVar2 = local_120;
      iVar1 = OneofDescriptor::field_count(local_b0);
      if (iVar1 <= iVar2) break;
      pFVar4 = OneofDescriptor::field(local_b0,local_120);
      psVar6 = FieldDescriptor::name_abi_cxx11_(pFVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"field_name",&local_141);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&oneof,&local_140);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      io::Printer::Print(this->printer_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&oneof,
                         "$descriptor_name$.oneofs_by_name[\'$oneof_name$\'].fields.append(\n  $descriptor_name$.fields_by_name[\'$field_name$\'])\n"
                        );
      io::Printer::Print(this->printer_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&oneof,
                         "$descriptor_name$.fields_by_name[\'$field_name$\'].containing_oneof = $descriptor_name$.oneofs_by_name[\'$oneof_name$\']\n"
                        );
      local_120 = local_120 + 1;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&oneof);
    m._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         m._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptor(
    const Descriptor& descriptor,
    const Descriptor* containing_descriptor) const {
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*descriptor.nested_type(i), &descriptor);
  }

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field_descriptor = *descriptor.field(i);
    FixForeignFieldsInField(&descriptor, field_descriptor, "fields_by_name");
  }

  FixContainingTypeInDescriptor(descriptor, containing_descriptor);
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *descriptor.enum_type(i);
    FixContainingTypeInDescriptor(enum_descriptor, &descriptor);
  }
  for (int i = 0; i < descriptor.oneof_decl_count(); ++i) {
    std::map<string, string> m;
    const OneofDescriptor* oneof = descriptor.oneof_decl(i);
    m["descriptor_name"] = ModuleLevelDescriptorName(descriptor);
    m["oneof_name"] = oneof->name();
    for (int j = 0; j < oneof->field_count(); ++j) {
      m["field_name"] = oneof->field(j)->name();
      printer_->Print(
          m,
          "$descriptor_name$.oneofs_by_name['$oneof_name$'].fields.append(\n"
          "  $descriptor_name$.fields_by_name['$field_name$'])\n");
      printer_->Print(
          m,
          "$descriptor_name$.fields_by_name['$field_name$'].containing_oneof = "
          "$descriptor_name$.oneofs_by_name['$oneof_name$']\n");
    }
  }
}